

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageIO.cpp
# Opt level: O2

bool nv::ImageIO::saveTGA(Stream *s,Image *img)

{
  Color32 CVar1;
  int iVar2;
  uint uVar3;
  Format FVar4;
  uint uVar5;
  Color32 *pCVar6;
  anon_union_4_2_12391d8d_for_Color32_0 *paVar7;
  TgaFile *tga;
  uint i;
  ulong uVar8;
  uint uVar9;
  TgaFile local_50;
  
  iVar2 = (*s->_vptr_Stream[6])();
  if ((char)iVar2 != '\0') {
    iVar2 = nvAbort("!s.isError()",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/ImageIO.cpp"
                    ,0x189,"bool nv::ImageIO::saveTGA(Stream &, const Image *)");
    if (iVar2 == 1) {
      raise(5);
    }
  }
  if (img == (Image *)0x0) {
    iVar2 = nvAbort("img != __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/ImageIO.cpp"
                    ,0x18a,"bool nv::ImageIO::saveTGA(Stream &, const Image *)");
    if (iVar2 == 1) {
      raise(5);
    }
  }
  pCVar6 = Image::pixels(img);
  if (pCVar6 == (Color32 *)0x0) {
    iVar2 = nvAbort("img->pixels() != __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/ImageIO.cpp"
                    ,0x18b,"bool nv::ImageIO::saveTGA(Stream &, const Image *)");
    if (iVar2 == 1) {
      raise(5);
    }
  }
  local_50.mem = (uint8 *)0x0;
  local_50.head.id_length = '\0';
  local_50.head.colormap_type = '\0';
  local_50.head.image_type = '\x02';
  local_50.head.colormap_index = 0;
  local_50.head.colormap_length = 0;
  local_50.head.colormap_size = '\0';
  local_50.head.x_origin = 0;
  local_50.head.y_origin = 0;
  uVar3 = Image::width(img);
  local_50.head.width = (uint16)uVar3;
  uVar3 = Image::height(img);
  local_50.head.height = (uint16)uVar3;
  FVar4 = Image::format(img);
  local_50.head.flags = ' ';
  if (FVar4 == Format_ARGB) {
    local_50.head.flags = '/';
  }
  local_50.head.pixel_size = (FVar4 == Format_ARGB) * '\b' + '\x18';
  TgaFile::allocate(&local_50);
  uVar3 = Image::width(img);
  uVar5 = Image::height(img);
  FVar4 = Image::format(img);
  if (FVar4 == Format_ARGB) {
    uVar9 = 3;
    for (uVar8 = 0; uVar5 * uVar3 != uVar8; uVar8 = uVar8 + 1) {
      paVar7 = &Image::pixel(img,(uint)uVar8)->field_0;
      CVar1.field_0 =
           (anon_union_4_2_12391d8d_for_Color32_0)
           *(anon_union_4_2_12391d8d_for_Color32_0 *)&paVar7->field_0;
      local_50.mem[uVar9 - 3] = CVar1.field_0._0_1_;
      local_50.mem[uVar9 - 2] = CVar1.field_0._1_1_;
      local_50.mem[uVar9 - 1] = CVar1.field_0._2_1_;
      local_50.mem[uVar9] = CVar1.field_0._3_1_;
      uVar9 = uVar9 + 4;
    }
  }
  else {
    uVar9 = 2;
    for (uVar8 = 0; uVar5 * uVar3 != uVar8; uVar8 = uVar8 + 1) {
      paVar7 = &Image::pixel(img,(uint)uVar8)->field_0;
      CVar1.field_0 =
           (anon_union_4_2_12391d8d_for_Color32_0)
           *(anon_union_4_2_12391d8d_for_Color32_0 *)&paVar7->field_0;
      local_50.mem[uVar9 - 2] = CVar1.field_0._0_1_;
      local_50.mem[uVar9 - 1] = CVar1.field_0._1_1_;
      local_50.mem[uVar9] = CVar1.field_0._2_1_;
      uVar9 = uVar9 + 3;
    }
  }
  tga = &local_50;
  operator<<(s,tga);
  TgaFile::free(&local_50,tga);
  TgaFile::free(&local_50,tga);
  return true;
}

Assistant:

bool nv::ImageIO::saveTGA(Stream & s, const Image * img)
{
	nvCheck(!s.isError());
	nvCheck(img != NULL);
	nvCheck(img->pixels() != NULL);
	
	TgaFile tga;
	tga.head.id_length = 0;
	tga.head.colormap_type = 0;
	tga.head.image_type = TGA_TYPE_RGB;

	tga.head.colormap_index = 0;
	tga.head.colormap_length = 0;
	tga.head.colormap_size = 0;

	tga.head.x_origin = 0;
	tga.head.y_origin = 0;
	tga.head.width = img->width();
	tga.head.height = img->height();
	if(img->format() == Image::Format_ARGB) {
		tga.head.pixel_size = 32;
		tga.head.flags = TGA_ORIGIN_UPPER | TGA_HAS_ALPHA;
	}
	else {
		tga.head.pixel_size = 24;
		tga.head.flags = TGA_ORIGIN_UPPER;
	}

	// @@ Serialize directly.
	tga.allocate();

	const uint n = img->width() * img->height();
	if(img->format() == Image::Format_ARGB) {
		for(uint i = 0; i < n; i++) {
			Color32 color = img->pixel(i);
			tga.mem[4 * i + 0] = color.b;
			tga.mem[4 * i + 1] = color.g;
			tga.mem[4 * i + 2] = color.r;
			tga.mem[4 * i + 3] = color.a;
		}
	}
	else {
		for(uint i = 0; i < n; i++) {
			Color32 color = img->pixel(i);
			tga.mem[3 * i + 0] = color.b;
			tga.mem[3 * i + 1] = color.g;
			tga.mem[3 * i + 2] = color.r;
		}
	}

	s << tga;
	
	tga.free();
	
	return true;
}